

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_8::DiskHandle::write(DiskHandle *this,int __fd,void *__buf,size_t __n)

{
  int osErrorNumber;
  ssize_t in_RAX;
  undefined4 in_register_00000034;
  long __offset;
  Fault f;
  Fault local_28;
  
  __offset = CONCAT44(in_register_00000034,__fd);
  do {
    if (__n == 0) {
      return in_RAX;
    }
    while( true ) {
      in_RAX = pwrite((this->fd).fd,__buf,__n,__offset);
      if (-1 < in_RAX) break;
      osErrorNumber = _::Debug::getOsErrorNumber(false);
      if (osErrorNumber != -1) {
        if (osErrorNumber != 0) {
          _::Debug::Fault::Fault
                    (&local_28,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0x178,osErrorNumber,"n = pwrite(fd, data.begin(), data.size(), offset)","");
          _::Debug::Fault::fatal(&local_28);
        }
        goto LAB_00319950;
      }
    }
    if (in_RAX == 0) {
LAB_00319950:
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                (&local_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x179,FAILED,"n > 0","\"pwrite() returned zero?\"",
                 (char (*) [24])"pwrite() returned zero?");
      _::Debug::Fault::fatal(&local_28);
    }
    __offset = __offset + in_RAX;
    __buf = (void *)((long)__buf + in_RAX);
    __n = __n - in_RAX;
  } while( true );
}

Assistant:

void write(uint64_t offset, ArrayPtr<const byte> data) const {
    // pwrite() probably never returns short writes unless there's no space left on disk.
    // Unfortunately, though, per spec we are not allowed to assume this.

    while (data.size() > 0) {
      ssize_t n;
      KJ_SYSCALL(n = pwrite(fd, data.begin(), data.size(), offset));
      KJ_ASSERT(n > 0, "pwrite() returned zero?");
      offset += n;
      data = data.slice(n, data.size());
    }
  }